

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summaryindex.cpp
# Opt level: O1

void summaryindex::indexevents
               (string *fullfilename,vector<int,_std::allocator<int>_> *event_ids,
               map<summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_keyz>,_std::allocator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
               *summary_id_file_id_to_offset,int file_id)

{
  iterator __position;
  iterator __position_00;
  bool bVar1;
  int iVar2;
  bool bVar3;
  FILE *__stream;
  size_t sVar4;
  vector<long_long,std::allocator<long_long>> *this;
  longlong offset;
  summary_keyz k;
  int summary_set;
  int summarycalcstream_type;
  summarySampleslevelHeader sh;
  int samplesize;
  longlong local_70;
  int local_64;
  key_type local_60;
  undefined4 local_58;
  uint local_54;
  vector<int,std::allocator<int>> *local_50;
  map<summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_keyz>,_std::allocator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  *local_48;
  int local_40;
  int local_3c;
  undefined1 local_34 [4];
  
  __stream = fopen((fullfilename->_M_dataplus)._M_p,"rb");
  if (__stream == (FILE *)0x0) {
    indexevents((summaryindex *)fullfilename);
  }
  else {
    local_70 = 0;
    local_54 = 0;
    sVar4 = fread(&local_54,4,1,__stream);
    if (sVar4 != 0) {
      local_70 = local_70 + 4;
    }
    fullfilename = (string *)(ulong)(local_54 & 0x3000000);
    if ((local_54 & 0x3000000) == 0x3000000) {
      sVar4 = fread(local_34,4,1,__stream);
      if (sVar4 == 0) {
        local_58 = 0;
      }
      else {
        local_70 = local_70 + 4;
        local_58 = 0;
        sVar4 = fread(&local_58,4,1,__stream);
        if (sVar4 != 0) {
          local_70 = local_70 + 4;
          local_64 = -1;
          local_50 = (vector<int,std::allocator<int>> *)event_ids;
          do {
            sVar4 = fread(&local_40,0xc,1,__stream);
            if (sVar4 != 0) {
              local_60.summary_id = local_3c;
              local_60.fileindex = file_id;
              local_48 = summary_id_file_id_to_offset;
              this = (vector<long_long,std::allocator<long_long>> *)
                     std::
                     map<summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_keyz>,_std::allocator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                     ::operator[](summary_id_file_id_to_offset,&local_60);
              __position._M_current = *(longlong **)(this + 8);
              if (__position._M_current == *(longlong **)(this + 0x10)) {
                std::vector<long_long,std::allocator<long_long>>::
                _M_realloc_insert<long_long_const&>(this,__position,&local_70);
              }
              else {
                *__position._M_current = local_70;
                *(longlong **)(this + 8) = __position._M_current + 1;
              }
              iVar2 = local_40;
              if (local_40 != local_64) {
                __position_00._M_current = *(int **)(local_50 + 8);
                if (__position_00._M_current == *(int **)(local_50 + 0x10)) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            (local_50,__position_00,&local_40);
                }
                else {
                  *__position_00._M_current = local_40;
                  *(int **)(local_50 + 8) = __position_00._M_current + 1;
                }
                local_64 = iVar2;
              }
              local_70 = local_70 + 0xc;
              summary_id_file_id_to_offset = local_48;
            }
            bVar3 = sVar4 == 0;
            do {
              bVar1 = bVar3;
              if ((bVar1) || (sVar4 = fread(&local_60,8,1,__stream), sVar4 == 0)) goto LAB_0010280c;
              local_70 = local_70 + 8;
              bVar3 = false;
            } while (local_60.summary_id != 0);
          } while (!bVar1);
        }
      }
LAB_0010280c:
      fclose(__stream);
      return;
    }
  }
  indexevents((summaryindex *)fullfilename);
}

Assistant:

void indexevents(const std::string& fullfilename, std::vector<int> &event_ids, std::map<summary_keyz, std::vector<long long>> &summary_id_file_id_to_offset, int file_id) {
	FILE* fin = fopen(fullfilename.c_str(), "rb");
	if (fin == NULL) {
		fprintf(stderr, "FATAL: cannot open %s\n",  fullfilename.c_str());
		exit(EXIT_FAILURE);
	}
	long long offset = 0;
	int summarycalcstream_type = 0;
	size_t i = fread(&summarycalcstream_type, sizeof(summarycalcstream_type), 1, fin);
	if (i != 0) offset += sizeof(summarycalcstream_type);
	int stream_type = summarycalcstream_type & summarycalc_id;

	if (stream_type != summarycalc_id) {
		fprintf(stderr, "FATAL: Not a summarycalc stream type %d\n",  stream_type);
		exit(-1);
	}

	stream_type = streamno_mask & summarycalcstream_type;
	int samplesize;
	i = fread(&samplesize, sizeof(samplesize), 1, fin);
	if (i != 0) offset += sizeof(samplesize);
	int summary_set = 0;
	if (i != 0) i = fread(&summary_set, sizeof(summary_set), 1, fin);
	if (i != 0) offset += sizeof(summary_set);
	summarySampleslevelHeader sh;
	int last_event_id = -1;
	while (i != 0) {
		i = fread(&sh, sizeof(sh), 1, fin);
		if (i != 0) {
			summary_keyz k;
			k.summary_id = sh.summary_id;
			k.fileindex = file_id;
			summary_id_file_id_to_offset[k].push_back(offset);
			if (sh.event_id != last_event_id) {
				last_event_id = sh.event_id;
				event_ids.push_back(sh.event_id);
			}
			// fprintf(stdout, "%d, %d, %lld\n", sh.summary_id,sh.event_id, offset);
			offset += sizeof(sh);
		}
		while (i != 0) {
			sampleslevelRec sr;
			i = fread(&sr, sizeof(sr), 1, fin);
			if (i != 0) offset += sizeof(sr);
			if (i == 0) break;
			if (sr.sidx == 0) break;
		}
	}

	fclose(fin);
}